

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O3

inform_dist * inform_dist_uniform(size_t n)

{
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  inform_dist *piVar3;
  long lVar4;
  ulong uVar5;
  int iVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  
  piVar3 = inform_dist_alloc(n);
  if ((piVar3 != (inform_dist *)0x0) && (piVar3->counts = n, auVar2 = _DAT_0010a080, n != 0)) {
    puVar1 = piVar3->histogram;
    lVar4 = n - 1;
    auVar6._8_4_ = (int)lVar4;
    auVar6._0_8_ = lVar4;
    auVar6._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar5 = 0;
    auVar6 = auVar6 ^ _DAT_0010a080;
    auVar8 = _DAT_0010a060;
    auVar9 = _DAT_0010a070;
    do {
      auVar10 = auVar9 ^ auVar2;
      iVar7 = auVar6._4_4_;
      if ((bool)(~(auVar10._4_4_ == iVar7 && auVar6._0_4_ < auVar10._0_4_ || iVar7 < auVar10._4_4_)
                & 1)) {
        puVar1[uVar5] = 1;
      }
      if ((auVar10._12_4_ != auVar6._12_4_ || auVar10._8_4_ <= auVar6._8_4_) &&
          auVar10._12_4_ <= auVar6._12_4_) {
        puVar1[uVar5 + 1] = 1;
      }
      auVar10 = auVar8 ^ auVar2;
      iVar11 = auVar10._4_4_;
      if (iVar11 <= iVar7 && (iVar11 != iVar7 || auVar10._0_4_ <= auVar6._0_4_)) {
        puVar1[uVar5 + 2] = 1;
        puVar1[uVar5 + 3] = 1;
      }
      uVar5 = uVar5 + 4;
      lVar4 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar4 + 4;
      lVar4 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar4 + 4;
    } while ((n + 3 & 0xfffffffffffffffc) != uVar5);
  }
  return piVar3;
}

Assistant:

inform_dist* inform_dist_uniform(size_t n)
{
    // construct a distribution of the desired size
    inform_dist *dist = inform_dist_alloc(n);
    if (dist != NULL)
    {
        // set the counts to the number of states
        dist->counts = n;
        // set the count for each state to 1
        for (size_t i = 0; i < n; ++i) dist->histogram[i] = 1;
    }
    return dist;
}